

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deAppendList.hpp
# Opt level: O3

void __thiscall
de::AppendList<vk::DebugReportMessage>::AppendList
          (AppendList<vk::DebugReportMessage> *this,size_t blockSize)

{
  Block *pBVar1;
  DebugReportMessage *pDVar2;
  
  this->m_blockSize = blockSize;
  this->m_numElements = 0;
  pBVar1 = (Block *)operator_new(0x18);
  pBVar1->blockNdx = 0;
  pDVar2 = (DebugReportMessage *)deAlignedMalloc(blockSize * 0x60,8);
  pBVar1->elements = pDVar2;
  pBVar1->next = (Block *)0x0;
  this->m_first = pBVar1;
  this->m_last = pBVar1;
  return;
}

Assistant:

AppendList<ElementType>::AppendList (size_t blockSize)
	: m_blockSize	(blockSize)
	, m_numElements	(0)
	, m_first		(new Block(0, blockSize))
	, m_last		(m_first)
{
}